

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  size_t __size;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *__ptr_01;
  unsigned_short *__ptr_02;
  int *__ptr_03;
  unsigned_short *__ptr_04;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  size_t sVar11;
  uint extraout_EDX;
  uint value;
  uint extraout_EDX_00;
  size_t sVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint *puVar23;
  LodePNGCompressSettings *pLVar24;
  bool bVar25;
  bool bVar26;
  size_t local_260;
  LodePNGCompressSettings *local_258;
  ucvector v;
  HuffmanTree tree_ll;
  uivector bitlen_lld_e;
  HuffmanTree tree_d;
  uivector lz77_encoded;
  uivector local_138;
  HuffmanTree tree_cl;
  uivector bitlen_lld;
  uivector frequencies_cl;
  uivector frequencies_d;
  uivector frequencies_ll;
  Hash local_60;
  
  v.data = *out;
  v.size = *outsize;
  local_260 = 0;
  uVar20 = settings->btype;
  if (uVar20 < 3) {
    sVar19 = insize;
    v.allocsize = v.size;
    if (uVar20 != 1) {
      if (uVar20 == 0) {
        uVar7 = (insize + 0xfffe) / 0xffff;
        local_258 = (LodePNGCompressSettings *)(uVar7 - 1);
        uVar20 = 0;
        for (uVar18 = 0; uVar18 != uVar7; uVar18 = uVar18 + 1) {
          ucvector_push_back(&v,(LodePNGCompressSettings *)uVar18 == local_258);
          iVar2 = (int)insize - uVar20;
          if (0xfffe < insize - uVar20) {
            iVar2 = 0xffff;
          }
          ucvector_push_back(&v,(uchar)iVar2);
          ucvector_push_back(&v,(uchar)((uint)iVar2 >> 8));
          ucvector_push_back(&v,(uchar)(0xffff - iVar2));
          ucvector_push_back(&v,(uchar)((uint)(0xffff - iVar2) >> 8));
          for (uVar13 = 0;
              (uVar13 < 0xffff && (uVar16 = (ulong)(uVar20 + (int)uVar13), uVar16 < insize));
              uVar13 = uVar13 + 1) {
            ucvector_push_back(&v,in[uVar16]);
          }
          uVar20 = uVar20 + (int)uVar13;
        }
        uVar20 = 0;
        goto LAB_00113600;
      }
      uVar7 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar7 = insize >> 3;
      }
      if (0x3fff7 < uVar7) {
        uVar7 = 0x3fff8;
      }
      sVar19 = uVar7 + 8;
    }
    uVar7 = 1;
    if (!CARRY8(insize - 1,sVar19)) {
      uVar7 = ((insize - 1) + sVar19) / sVar19;
    }
    uVar18 = (ulong)settings->windowsize;
    local_258 = settings;
    __ptr = (int *)malloc(0x40000);
    local_60.head = __ptr;
    __ptr_00 = (int *)malloc(uVar18 * 4);
    __size = uVar18 * 2;
    local_60.val = __ptr_00;
    __ptr_01 = (unsigned_short *)malloc(__size);
    local_60.chain = __ptr_01;
    __ptr_02 = (unsigned_short *)malloc(__size);
    local_60.zeros = __ptr_02;
    __ptr_03 = (int *)malloc(0x40c);
    local_60.headz = __ptr_03;
    __ptr_04 = (unsigned_short *)malloc(__size);
    uVar20 = 0x53;
    if (((((__ptr_00 != (int *)0x0) && (__ptr != (int *)0x0)) && (__ptr_01 != (unsigned_short *)0x0)
         ) && ((__ptr_02 != (unsigned_short *)0x0 && (__ptr_03 != (int *)0x0)))) &&
       (__ptr_04 != (unsigned_short *)0x0)) {
      for (lVar8 = 0; lVar8 != 0x10000; lVar8 = lVar8 + 1) {
        __ptr[lVar8] = -1;
      }
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        __ptr_00[uVar13] = -1;
      }
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        __ptr_01[uVar13] = (unsigned_short)uVar13;
      }
      for (lVar8 = 0; lVar8 != 0x103; lVar8 = lVar8 + 1) {
        __ptr_03[lVar8] = -1;
      }
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        __ptr_04[uVar13] = (unsigned_short)uVar13;
      }
      uVar18 = 0;
      uVar20 = 0;
      pLVar24 = local_258;
      local_60.chainz = __ptr_04;
LAB_00112b8a:
      if ((uVar18 != uVar7) && (uVar20 == 0)) {
        bVar26 = uVar18 == uVar7 - 1;
        uVar16 = uVar18 * sVar19;
        uVar13 = sVar19 + uVar16;
        if (insize <= sVar19 + uVar16) {
          uVar13 = insize;
        }
        if (pLVar24->btype == 2) {
          lz77_encoded.allocsize = 0;
          tree_ll.lengths = (uint *)0x0;
          lz77_encoded.data = (uint *)0x0;
          lz77_encoded.size = 0;
          tree_d.lengths = (uint *)0x0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          frequencies_ll.allocsize = 0;
          tree_cl.tree2d = (uint *)0x0;
          tree_cl.tree1d = (uint *)0x0;
          frequencies_d.allocsize = 0;
          frequencies_ll.data = (uint *)0x0;
          frequencies_ll.size = 0;
          frequencies_cl.allocsize = 0;
          frequencies_d.data = (uint *)0x0;
          frequencies_d.size = 0;
          bitlen_lld.allocsize = 0;
          frequencies_cl.data = (uint *)0x0;
          frequencies_cl.size = 0;
          bitlen_lld_e.allocsize = 0;
          bitlen_lld.data = (uint *)0x0;
          bitlen_lld.size = 0;
          local_138.allocsize = 0;
          bitlen_lld_e.data = (uint *)0x0;
          bitlen_lld_e.size = 0;
          local_138.data = (uint *)0x0;
          local_138.size = 0;
          if (pLVar24->use_lz77 == 0) {
            uVar6 = uivector_resize(&lz77_encoded,uVar13 - uVar16);
            uVar20 = 0x53;
            puVar9 = lz77_encoded.data;
            if (uVar6 != 0) {
              for (; uVar6 = extraout_EDX_00, uVar16 < uVar13; uVar16 = uVar16 + 1) {
                *puVar9 = (uint)in[uVar16];
                puVar9 = puVar9 + 1;
              }
              goto LAB_00112e1e;
            }
          }
          else {
            uVar20 = encodeLZ77(&lz77_encoded,&local_60,in,uVar16,uVar13,pLVar24->windowsize,
                                pLVar24->minmatch,pLVar24->nicematch,pLVar24->lazymatching);
            uVar6 = extraout_EDX;
            if (uVar20 == 0) {
LAB_00112e1e:
              uVar6 = uivector_resizev(&frequencies_ll,0x11e,uVar6);
              uVar20 = 0x53;
              if (uVar6 != 0) {
                uVar6 = uivector_resizev(&frequencies_d,0x1e,value);
                puVar9 = frequencies_d.data;
                uVar20 = 0x53;
                if (uVar6 != 0) {
                  for (sVar12 = 0; sVar12 != lz77_encoded.size; sVar12 = sVar12 + 1) {
                    uVar20 = lz77_encoded.data[sVar12];
                    frequencies_ll.data[uVar20] = frequencies_ll.data[uVar20] + 1;
                    if (0x100 < (ulong)uVar20) {
                      frequencies_d.data[lz77_encoded.data[sVar12 + 2]] =
                           frequencies_d.data[lz77_encoded.data[sVar12 + 2]] + 1;
                      sVar12 = sVar12 + 3;
                    }
                  }
                  frequencies_ll.data[0x100] = 1;
                  uVar20 = HuffmanTree_makeFromFrequencies
                                     (&tree_ll,frequencies_ll.data,0x101,frequencies_ll.size,0xf);
                  if ((uVar20 == 0) &&
                     (uVar20 = HuffmanTree_makeFromFrequencies
                                         (&tree_d,puVar9,2,frequencies_d.size,0xf),
                     uVar6 = tree_d.numcodes, puVar9 = tree_ll.lengths, uVar20 == 0)) {
                    uVar3 = tree_ll.numcodes;
                    if (0x11d < tree_ll.numcodes) {
                      uVar3 = 0x11e;
                    }
                    uVar13 = extraout_RDX;
                    for (uVar16 = 0; puVar23 = tree_d.lengths, uVar3 != uVar16; uVar16 = uVar16 + 1)
                    {
                      uivector_push_back(&bitlen_lld,puVar9[uVar16]);
                      uVar13 = extraout_RDX_00;
                    }
                    uVar16 = (ulong)uVar6;
                    if (0x1d < uVar6) {
                      uVar16 = 0x1e;
                    }
                    for (uVar21 = 0; puVar5 = bitlen_lld.data, uVar16 != uVar21; uVar21 = uVar21 + 1
                        ) {
                      uivector_push_back(&bitlen_lld,puVar23[uVar21]);
                      uVar13 = extraout_RDX_01;
                    }
                    uVar21 = bitlen_lld.size & 0xffffffff;
                    for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
                      uVar20 = puVar5[uVar22];
                      uVar6 = 0;
                      while( true ) {
                        uVar14 = (ulong)uVar6;
                        uVar13 = uVar22 + 1 + uVar14;
                        if ((uVar21 <= uVar13) || (puVar5[uVar13] != uVar20)) break;
                        uVar6 = uVar6 + 1;
                      }
                      if ((uVar20 == 0) && (1 < uVar6)) {
                        uVar20 = uVar6 + 1;
                        if (uVar20 < 0xb) {
                          uivector_push_back(&bitlen_lld_e,0x11);
                          uivector_push_back(&bitlen_lld_e,uVar6 - 2);
                          uVar13 = extraout_RDX_02;
                        }
                        else {
                          if (0x89 < uVar20) {
                            uVar20 = 0x8a;
                          }
                          uivector_push_back(&bitlen_lld_e,0x12);
                          uivector_push_back(&bitlen_lld_e,uVar20 - 0xb);
                          uVar14 = (ulong)(uVar20 - 1);
                          uVar13 = extraout_RDX_06;
                        }
LAB_00113284:
                        uVar22 = uVar22 + uVar14;
                      }
                      else {
                        uivector_push_back(&bitlen_lld_e,uVar20);
                        uVar13 = extraout_RDX_03;
                        if (2 < uVar6) {
                          uVar10 = uVar14 / 6;
                          uVar13 = uVar14 % 6;
                          while (bVar25 = uVar10 != 0, uVar10 = uVar10 - 1, bVar25) {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,3);
                            uVar13 = extraout_RDX_04;
                          }
                          if (uVar6 % 6 < 3) {
                            uVar14 = (ulong)(uVar6 - uVar6 % 6);
                            pLVar24 = local_258;
                          }
                          else {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,uVar6 % 6 - 3);
                            uVar13 = extraout_RDX_05;
                            pLVar24 = local_258;
                          }
                          goto LAB_00113284;
                        }
                      }
                    }
                    uVar6 = uivector_resizev(&frequencies_cl,0x13,(uint)uVar13);
                    sVar12 = bitlen_lld_e.size;
                    puVar23 = bitlen_lld_e.data;
                    uVar20 = 0x53;
                    if (uVar6 != 0) {
                      for (sVar11 = 0; sVar11 != bitlen_lld_e.size;
                          sVar11 = (sVar11 - (bitlen_lld_e.data[sVar11] < 0x10)) + 2) {
                        frequencies_cl.data[bitlen_lld_e.data[sVar11]] =
                             frequencies_cl.data[bitlen_lld_e.data[sVar11]] + 1;
                      }
                      uVar20 = HuffmanTree_makeFromFrequencies
                                         (&tree_cl,frequencies_cl.data,frequencies_cl.size,
                                          frequencies_cl.size,7);
                      if (uVar20 == 0) {
                        uVar13 = (ulong)tree_cl.numcodes;
                        uVar6 = uivector_resize(&local_138,uVar13);
                        puVar5 = tree_cl.lengths;
                        uVar20 = 0x53;
                        if (uVar6 != 0) {
                          for (lVar8 = 0; uVar13 << 2 != lVar8; lVar8 = lVar8 + 4) {
                            *(uint *)((long)local_138.data + lVar8) =
                                 tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar8)];
                          }
                          do {
                            sVar15 = local_138.size;
                            puVar1 = local_138.data;
                            sVar11 = local_260;
                            if ((local_138.size < 5) || (local_138.data[local_138.size - 1] != 0)) {
                              if ((local_260 & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              v.data[v.size - 1] = v.data[v.size - 1] | bVar26 << ((byte)sVar11 & 7)
                              ;
                              if (((int)sVar11 + 1U & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              if ((sVar11 + 2 & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              v.data[v.size - 1] =
                                   v.data[v.size - 1] | '\x01' << ((byte)(sVar11 + 2) & 7);
                              local_260 = sVar11 + 3;
                              uVar13 = (ulong)((int)sVar15 - 4) + 3;
                              uVar20 = (int)sVar15 - 3;
                              goto LAB_00113436;
                            }
                            uVar20 = uivector_resize(&local_138,local_138.size - 1);
                          } while (uVar20 != 0);
                          uVar20 = 0x53;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0011300c;
        }
        uVar20 = 0;
        if (pLVar24->btype == 1) {
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          sVar12 = local_260;
          if ((local_260 & 7) == 0) {
            ucvector_push_back(&v,'\0');
          }
          bVar17 = bVar26 << ((byte)sVar12 & 7) | v.data[v.size - 1];
          v.data[v.size - 1] = bVar17;
          if ((sVar12 + 1 & 7) == 0) {
            ucvector_push_back(&v,'\0');
            bVar17 = v.data[v.size - 1];
          }
          v.data[v.size - 1] = '\x01' << ((byte)(sVar12 + 1) & 7) | bVar17;
          if (((int)sVar12 + 2U & 7) == 0) {
            ucvector_push_back(&v,'\0');
          }
          puVar23 = tree_ll.lengths;
          puVar9 = tree_ll.tree1d;
          local_260 = sVar12 + 3;
          if (pLVar24->use_lz77 == 0) {
            for (; uVar16 < uVar13; uVar16 = uVar16 + 1) {
              addHuffmanSymbol(&local_260,&v,puVar9[in[uVar16]],puVar23[in[uVar16]]);
            }
LAB_00112f71:
            addHuffmanSymbol(&local_260,&v,puVar9[0x100],puVar23[0x100]);
            uVar20 = 0;
            pLVar24 = local_258;
          }
          else {
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            uVar20 = encodeLZ77((uivector *)&tree_cl,&local_60,in,uVar16,uVar13,pLVar24->windowsize,
                                pLVar24->minmatch,pLVar24->nicematch,pLVar24->lazymatching);
            if (uVar20 == 0) {
              writeLZ77data(&local_260,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              uivector_cleanup(&tree_cl);
              puVar9 = tree_ll.tree1d;
              puVar23 = tree_ll.lengths;
              goto LAB_00112f71;
            }
            uivector_cleanup(&tree_cl);
          }
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
        }
        goto LAB_001130a3;
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      free(__ptr_04);
    }
  }
  else {
    uVar20 = 0x3d;
  }
LAB_00113600:
  *out = v.data;
  *outsize = v.size;
  return uVar20;
  while( true ) {
    uVar22 = uVar13 & 0xffffffff;
    uVar13 = uVar13 - 1;
    sVar15 = (size_t)((int)sVar15 - 1);
    if (puVar1[uVar22] != 0) break;
LAB_00113436:
    uVar21 = sVar15 & 0xffffffff;
    uVar20 = uVar20 - 1;
    if (uVar13 == 3) break;
  }
  addBitsToStream(&local_260,&v,uVar3 - 0x101,5);
  addBitsToStream(&local_260,&v,(int)uVar16 - 1,5);
  addBitsToStream(&local_260,&v,uVar20,4);
  for (uVar13 = 0; puVar4 = tree_cl.tree1d, uVar21 != uVar13; uVar13 = uVar13 + 1) {
    addBitsToStream(&local_260,&v,puVar1[uVar13],3);
  }
  for (sVar11 = 0; sVar11 != sVar12; sVar11 = sVar11 + 1) {
    addHuffmanSymbol(&local_260,&v,puVar4[puVar23[sVar11]],puVar5[puVar23[sVar11]]);
    puVar1 = puVar23 + sVar11;
    if (*puVar1 - 0x10 < 3) {
      lVar8 = sVar11 + 1;
      sVar11 = sVar11 + 1;
      addBitsToStream(&local_260,&v,puVar23[lVar8],
                      *(size_t *)(&DAT_0011c0f0 + (ulong)(*puVar1 - 0x10) * 8));
    }
  }
  writeLZ77data(&local_260,&v,&lz77_encoded,&tree_ll,&tree_d);
  pLVar24 = local_258;
  uVar6 = puVar9[0x100];
  uVar20 = 0x40;
  if (uVar6 != 0) {
    addHuffmanSymbol(&local_260,&v,tree_ll.tree1d[0x100],uVar6);
    uVar20 = 0;
  }
LAB_0011300c:
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  uivector_cleanup(&frequencies_ll);
  uivector_cleanup(&frequencies_d);
  uivector_cleanup(&frequencies_cl);
  uivector_cleanup(&bitlen_lld_e);
  uivector_cleanup(&bitlen_lld);
  uivector_cleanup(&local_138);
LAB_001130a3:
  uVar18 = uVar18 + 1;
  goto LAB_00112b8a;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}